

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_257,_true,_embree::sse2::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  RayQueryContext *extraout_RDX;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar69;
  float fVar70;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar71 [12];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  vfloat4 a;
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar94;
  float fVar96;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar97;
  undefined1 auVar92 [16];
  float fVar98;
  float fVar99;
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar100 [16];
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar101 [16];
  uint uVar108;
  uint uVar109;
  float fVar110;
  uint uVar111;
  float fVar112;
  uint uVar113;
  float fVar114;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  ulong local_1088;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fd8 = aVar2.x;
    fVar63 = aVar2.y;
    local_fc8 = aVar2.z;
    aVar69 = aVar2.field_3;
    fVar26 = fVar63 * fVar63;
    fVar27 = local_fc8 * local_fc8;
    fVar28 = aVar69.w * aVar69.w;
    fVar44 = fVar26 + local_fd8 * local_fd8 + fVar27;
    auVar51._0_8_ = CONCAT44(fVar26 + fVar26 + fVar28,fVar44);
    auVar51._8_4_ = fVar26 + fVar27 + fVar27;
    auVar51._12_4_ = fVar26 + fVar28 + fVar28;
    auVar40._8_4_ = auVar51._8_4_;
    auVar40._0_8_ = auVar51._0_8_;
    auVar40._12_4_ = auVar51._12_4_;
    auVar51 = rsqrtss(auVar40,auVar51);
    fVar26 = auVar51._0_4_;
    local_fb8[0] = fVar26 * 1.5 - fVar26 * fVar26 * fVar44 * 0.5 * fVar26;
    fVar26 = local_fd8 * local_fb8[0];
    fVar27 = fVar63 * local_fb8[0];
    fVar28 = local_fc8 * local_fb8[0];
    fVar77 = -fVar27;
    fVar44 = -fVar28;
    auVar71._8_4_ = 0xffffffff;
    auVar71._0_8_ = 0xffffffffffffffff;
    if (fVar77 * fVar77 + fVar28 * fVar28 + 0.0 <= fVar26 * fVar26 + fVar44 * fVar44 + 0.0) {
      auVar71 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar64 = (float)((uint)fVar28 & auVar71._4_4_);
    fVar44 = (float)(~auVar71._0_4_ & (uint)fVar44);
    fVar67 = (float)(~auVar71._8_4_ & (uint)fVar26 | (uint)fVar77 & auVar71._8_4_);
    fVar77 = fVar64 * fVar64;
    fVar66 = fVar67 * fVar67;
    fVar78 = fVar77 + fVar44 * fVar44 + fVar66;
    auVar73._0_8_ = CONCAT44(fVar77 + fVar77 + 0.0,fVar78);
    auVar73._8_4_ = fVar77 + fVar66 + fVar66;
    auVar73._12_4_ = fVar77 + 0.0 + 0.0;
    auVar84._8_4_ = auVar73._8_4_;
    auVar84._0_8_ = auVar73._0_8_;
    auVar84._12_4_ = auVar73._12_4_;
    auVar51 = rsqrtss(auVar84,auVar73);
    fVar77 = auVar51._0_4_;
    fVar77 = fVar77 * 1.5 - fVar77 * fVar77 * fVar78 * 0.5 * fVar77;
    fVar44 = fVar77 * fVar44;
    fVar64 = fVar77 * fVar64;
    fVar67 = fVar77 * fVar67;
    fVar66 = fVar64 * fVar26 - fVar27 * fVar44;
    fVar78 = fVar67 * fVar27 - fVar28 * fVar64;
    fVar74 = fVar44 * fVar28 - fVar26 * fVar67;
    fVar76 = fVar77 * 0.0 * aVar69.w * local_fb8[0] - aVar69.w * local_fb8[0] * fVar77 * 0.0;
    fVar77 = fVar78 * fVar78;
    fVar75 = fVar74 * fVar74;
    fVar76 = fVar76 * fVar76;
    fVar88 = fVar75 + fVar77 + fVar66 * fVar66;
    fVar89 = fVar76 + fVar77 + fVar77;
    fVar75 = fVar75 + fVar77 + fVar75;
    fVar76 = fVar76 + fVar77 + fVar76;
    auVar62._4_4_ = fVar89;
    auVar62._0_4_ = fVar88;
    auVar62._8_4_ = fVar75;
    auVar62._12_4_ = fVar76;
    auVar46._4_4_ = fVar89;
    auVar46._0_4_ = fVar88;
    auVar46._8_4_ = fVar75;
    auVar46._12_4_ = fVar76;
    auVar51 = rsqrtss(auVar62,auVar46);
    fVar77 = auVar51._0_4_;
    fVar77 = fVar77 * 1.5 - fVar77 * fVar77 * fVar88 * 0.5 * fVar77;
    local_f88._4_4_ = fVar77 * fVar66;
    local_f88._0_4_ = fVar67;
    local_f88._8_4_ = local_fb8[0] * fVar28;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar77 * fVar74;
    local_f98._0_4_ = fVar64;
    local_f98._8_4_ = local_fb8[0] * fVar27;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar77 * fVar78;
    local_fa8._0_4_ = fVar44;
    local_fa8._8_4_ = local_fb8[0] * fVar26;
    local_fa8._12_4_ = 0;
    pauVar20 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    local_1048 = (ray->super_RayK<1>).org.field_0.m128[0];
    local_1058 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_1008 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar27 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar26 = (ray->super_RayK<1>).tfar;
    fVar28 = 0.0;
    if (0.0 <= fVar26) {
      fVar28 = fVar26;
    }
    local_1018 = 0.0;
    if (0.0 <= fVar27) {
      local_1018 = fVar27;
    }
    auVar51 = divps(_DAT_01f46a60,(undefined1  [16])aVar2);
    local_10a8 = (float)(~-(uint)(1e-18 <= ABS(local_fd8)) & 0x5d5e0b6b |
                        auVar51._0_4_ & -(uint)(1e-18 <= ABS(local_fd8)));
    local_10b8 = (float)(~-(uint)(1e-18 <= ABS(fVar63)) & 0x5d5e0b6b |
                        auVar51._4_4_ & -(uint)(1e-18 <= ABS(fVar63)));
    local_1028 = (float)(~-(uint)(1e-18 <= ABS(local_fc8)) & 0x5d5e0b6b |
                        auVar51._8_4_ & -(uint)(1e-18 <= ABS(local_fc8)));
    local_1068 = local_10a8 * 0.99999964;
    local_1098 = local_10b8 * 0.99999964;
    local_1038 = local_1028 * 0.99999964;
    local_10a8 = local_10a8 * 1.0000004;
    local_10b8 = local_10b8 * 1.0000004;
    local_1028 = local_1028 * 1.0000004;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    local_fe8._4_4_ = fVar63;
    local_fe8._0_4_ = fVar63;
    fStack_fe0 = fVar63;
    fStack_fdc = fVar63;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    uVar18 = (ulong)(local_1068 < 0.0) << 4;
    uVar21 = (ulong)(local_1098 < 0.0) << 4 | 0x20;
    uVar22 = (ulong)(local_1038 < 0.0) << 4 | 0x40;
    local_1080 = ray;
    fStack_1004 = local_1008;
    fStack_1000 = local_1008;
    fStack_ffc = local_1008;
    fStack_1014 = local_1018;
    fStack_1010 = local_1018;
    fStack_100c = local_1018;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    local_1088 = uVar18;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    fStack_1094 = local_1098;
    fStack_1090 = local_1098;
    fStack_108c = local_1098;
    fStack_10a4 = local_10a8;
    fStack_10a0 = local_10a8;
    fStack_109c = local_10a8;
    fStack_10b4 = local_10b8;
    fStack_10b0 = local_10b8;
    fStack_10ac = local_10b8;
    uVar19 = uVar18;
    fVar26 = fVar28;
    fVar27 = fVar28;
    fVar44 = fVar28;
    fVar63 = local_1018;
    fVar77 = local_1018;
    fVar64 = local_1018;
    fVar66 = local_1018;
    fVar67 = local_1068;
    fVar78 = local_1068;
    fVar74 = local_1068;
    fVar75 = local_1068;
    fVar76 = local_1048;
    fVar88 = local_1048;
    fVar89 = local_1048;
    fVar114 = local_1048;
    fVar95 = local_1058;
    fVar97 = local_1058;
    fVar99 = local_1058;
    fVar103 = local_1058;
    fVar105 = local_1008;
    fVar107 = local_1008;
    fVar110 = local_1008;
    fVar112 = local_1008;
    fVar59 = local_10b8;
    fVar65 = local_10b8;
    fVar68 = local_10b8;
    fVar70 = local_10b8;
    fVar79 = local_1098;
    fVar80 = local_1098;
    fVar81 = local_1098;
    fVar82 = local_1098;
    fVar83 = local_10a8;
    fVar85 = local_10a8;
    fVar86 = local_10a8;
    fVar87 = local_10a8;
    fVar90 = local_1028;
    fVar93 = local_1028;
    fVar94 = local_1028;
    fVar96 = local_1028;
    fVar98 = local_1038;
    fVar102 = local_1038;
    fVar104 = local_1038;
    fVar106 = local_1038;
LAB_00568896:
    if (pauVar20 != (undefined1 (*) [16])&local_f78) {
      pauVar14 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar14 + 8) < *pfVar1 || *(float *)((long)*pauVar14 + 8) == *pfVar1) {
        uVar15 = *(ulong *)*pauVar20;
LAB_005688bb:
        if ((uVar15 & 0xf) == 0) {
          pfVar1 = (float *)(uVar15 + 0x20 + uVar19);
          auVar29._0_4_ = (*pfVar1 - fVar76) * fVar67;
          auVar29._4_4_ = (pfVar1[1] - fVar88) * fVar78;
          auVar29._8_4_ = (pfVar1[2] - fVar89) * fVar74;
          auVar29._12_4_ = (pfVar1[3] - fVar114) * fVar75;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar21);
          auVar38._0_4_ = (*pfVar1 - fVar95) * fVar79;
          auVar38._4_4_ = (pfVar1[1] - fVar97) * fVar80;
          auVar38._8_4_ = (pfVar1[2] - fVar99) * fVar81;
          auVar38._12_4_ = (pfVar1[3] - fVar103) * fVar82;
          auVar51 = maxps(auVar29,auVar38);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar22);
          auVar39._0_4_ = (*pfVar1 - fVar105) * fVar98;
          auVar39._4_4_ = (pfVar1[1] - fVar107) * fVar102;
          auVar39._8_4_ = (pfVar1[2] - fVar110) * fVar104;
          auVar39._12_4_ = (pfVar1[3] - fVar112) * fVar106;
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar18 ^ 0x10));
          auVar45._0_4_ = (*pfVar1 - fVar76) * fVar83;
          auVar45._4_4_ = (pfVar1[1] - fVar88) * fVar85;
          auVar45._8_4_ = (pfVar1[2] - fVar89) * fVar86;
          auVar45._12_4_ = (pfVar1[3] - fVar114) * fVar87;
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar21 ^ 0x10));
          auVar52._0_4_ = (*pfVar1 - fVar95) * fVar59;
          auVar52._4_4_ = (pfVar1[1] - fVar97) * fVar65;
          auVar52._8_4_ = (pfVar1[2] - fVar99) * fVar68;
          auVar52._12_4_ = (pfVar1[3] - fVar103) * fVar70;
          auVar46 = minps(auVar45,auVar52);
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar22 ^ 0x10));
          auVar53._0_4_ = (*pfVar1 - fVar105) * fVar90;
          auVar53._4_4_ = (pfVar1[1] - fVar107) * fVar93;
          auVar53._8_4_ = (pfVar1[2] - fVar110) * fVar94;
          auVar53._12_4_ = (pfVar1[3] - fVar112) * fVar96;
          auVar8._4_4_ = fVar77;
          auVar8._0_4_ = fVar63;
          auVar8._8_4_ = fVar64;
          auVar8._12_4_ = fVar66;
          auVar40 = maxps(auVar39,auVar8);
          _local_10c8 = maxps(auVar51,auVar40);
          auVar7._4_4_ = fVar26;
          auVar7._0_4_ = fVar28;
          auVar7._8_4_ = fVar27;
          auVar7._12_4_ = fVar44;
          auVar51 = minps(auVar53,auVar7);
          auVar51 = minps(auVar46,auVar51);
          auVar30._4_4_ = -(uint)(local_10c8._4_4_ <= auVar51._4_4_);
          auVar30._0_4_ = -(uint)(local_10c8._0_4_ <= auVar51._0_4_);
          auVar30._8_4_ = -(uint)(local_10c8._8_4_ <= auVar51._8_4_);
          auVar30._12_4_ = -(uint)(local_10c8._12_4_ <= auVar51._12_4_);
          uVar17 = movmskps((int)context,auVar30);
        }
        else {
          if ((int)(uVar15 & 0xf) != 2) {
            (**(code **)((long)local_1078->leafIntersector +
                        (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1070);
            fVar28 = (local_1080->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1080;
            uVar19 = local_1088;
            fVar26 = fVar28;
            fVar27 = fVar28;
            fVar44 = fVar28;
            fVar63 = local_1018;
            fVar77 = fStack_1014;
            fVar64 = fStack_1010;
            fVar66 = fStack_100c;
            fVar67 = local_1068;
            fVar78 = fStack_1064;
            fVar74 = fStack_1060;
            fVar75 = fStack_105c;
            fVar76 = local_1048;
            fVar88 = fStack_1044;
            fVar89 = fStack_1040;
            fVar114 = fStack_103c;
            fVar95 = local_1058;
            fVar97 = fStack_1054;
            fVar99 = fStack_1050;
            fVar103 = fStack_104c;
            fVar105 = local_1008;
            fVar107 = fStack_1004;
            fVar110 = fStack_1000;
            fVar112 = fStack_ffc;
            fVar59 = local_10b8;
            fVar65 = fStack_10b4;
            fVar68 = fStack_10b0;
            fVar70 = fStack_10ac;
            fVar79 = local_1098;
            fVar80 = fStack_1094;
            fVar81 = fStack_1090;
            fVar82 = fStack_108c;
            fVar83 = local_10a8;
            fVar85 = fStack_10a4;
            fVar86 = fStack_10a0;
            fVar87 = fStack_109c;
            fVar90 = local_1028;
            fVar93 = fStack_1024;
            fVar94 = fStack_1020;
            fVar96 = fStack_101c;
            fVar98 = local_1038;
            fVar102 = fStack_1034;
            fVar104 = fStack_1030;
            fVar106 = fStack_102c;
            goto LAB_00568896;
          }
          uVar16 = uVar15 & 0xfffffffffffffff0;
          local_ff8 = *(float *)(uVar16 + 0x70);
          fStack_ff4 = *(float *)(uVar16 + 0x74);
          fStack_ff0 = *(float *)(uVar16 + 0x78);
          fStack_fec = *(float *)(uVar16 + 0x7c);
          fVar76 = local_fd8 * *(float *)(uVar16 + 0x20) +
                   (float)local_fe8._0_4_ * *(float *)(uVar16 + 0x50) +
                   local_fc8 * *(float *)(uVar16 + 0x80);
          fVar88 = fStack_fd4 * *(float *)(uVar16 + 0x24) +
                   (float)local_fe8._4_4_ * *(float *)(uVar16 + 0x54) +
                   fStack_fc4 * *(float *)(uVar16 + 0x84);
          fVar89 = fStack_fd0 * *(float *)(uVar16 + 0x28) +
                   fStack_fe0 * *(float *)(uVar16 + 0x58) + fStack_fc0 * *(float *)(uVar16 + 0x88);
          fVar114 = fStack_fcc * *(float *)(uVar16 + 0x2c) +
                    fStack_fdc * *(float *)(uVar16 + 0x5c) + fStack_fbc * *(float *)(uVar16 + 0x8c);
          fVar63 = local_fd8 * *(float *)(uVar16 + 0x30) +
                   (float)local_fe8._0_4_ * *(float *)(uVar16 + 0x60) +
                   local_fc8 * *(float *)(uVar16 + 0x90);
          fVar77 = fStack_fd4 * *(float *)(uVar16 + 0x34) +
                   (float)local_fe8._4_4_ * *(float *)(uVar16 + 100) +
                   fStack_fc4 * *(float *)(uVar16 + 0x94);
          fVar64 = fStack_fd0 * *(float *)(uVar16 + 0x38) +
                   fStack_fe0 * *(float *)(uVar16 + 0x68) + fStack_fc0 * *(float *)(uVar16 + 0x98);
          fVar66 = fStack_fcc * *(float *)(uVar16 + 0x3c) +
                   fStack_fdc * *(float *)(uVar16 + 0x6c) + fStack_fbc * *(float *)(uVar16 + 0x9c);
          fVar67 = local_fd8 * *(float *)(uVar16 + 0x40) +
                   (float)local_fe8._0_4_ * local_ff8 + local_fc8 * *(float *)(uVar16 + 0xa0);
          fVar78 = fStack_fd4 * *(float *)(uVar16 + 0x44) +
                   (float)local_fe8._4_4_ * fStack_ff4 + fStack_fc4 * *(float *)(uVar16 + 0xa4);
          fVar74 = fStack_fd0 * *(float *)(uVar16 + 0x48) +
                   fStack_fe0 * fStack_ff0 + fStack_fc0 * *(float *)(uVar16 + 0xa8);
          fVar75 = fStack_fcc * *(float *)(uVar16 + 0x4c) +
                   fStack_fdc * fStack_fec + fStack_fbc * *(float *)(uVar16 + 0xac);
          uVar108 = (uint)DAT_01f46710;
          uVar109 = DAT_01f46710._4_4_;
          uVar111 = DAT_01f46710._8_4_;
          uVar113 = DAT_01f46710._12_4_;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar76 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar88 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar89 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar114 & uVar113));
          auVar91._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar91._8_4_ = ~uVar24 & 0x219392ef;
          auVar91._12_4_ = ~uVar25 & 0x219392ef;
          auVar12._4_4_ = (uint)fVar88 & uVar23;
          auVar12._0_4_ = (uint)fVar76 & uVar17;
          auVar12._8_4_ = (uint)fVar89 & uVar24;
          auVar12._12_4_ = (uint)fVar114 & uVar25;
          auVar91 = auVar91 | auVar12;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar63 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar77 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar64 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar66 & uVar113));
          auVar31._0_4_ = (uint)fVar63 & uVar17;
          auVar31._4_4_ = (uint)fVar77 & uVar23;
          auVar31._8_4_ = (uint)fVar64 & uVar24;
          auVar31._12_4_ = (uint)fVar66 & uVar25;
          auVar100._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar100._8_4_ = ~uVar24 & 0x219392ef;
          auVar100._12_4_ = ~uVar25 & 0x219392ef;
          auVar100 = auVar100 | auVar31;
          uVar17 = -(uint)(1e-18 <= (float)((uint)fVar67 & uVar108));
          uVar23 = -(uint)(1e-18 <= (float)((uint)fVar78 & uVar109));
          uVar24 = -(uint)(1e-18 <= (float)((uint)fVar74 & uVar111));
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar75 & uVar113));
          auVar32._0_8_ = CONCAT44(~uVar23,~uVar17) & 0x219392ef219392ef;
          auVar32._8_4_ = ~uVar24 & 0x219392ef;
          auVar32._12_4_ = ~uVar25 & 0x219392ef;
          auVar9._4_4_ = (uint)fVar78 & uVar23;
          auVar9._0_4_ = (uint)fVar67 & uVar17;
          auVar9._8_4_ = (uint)fVar74 & uVar24;
          auVar9._12_4_ = (uint)fVar75 & uVar25;
          auVar32 = auVar32 | auVar9;
          auVar51 = rcpps(_DAT_01f46710,auVar91);
          fVar74 = auVar51._0_4_;
          fVar75 = auVar51._4_4_;
          fVar76 = auVar51._8_4_;
          fVar88 = auVar51._12_4_;
          fVar74 = (1.0 - auVar91._0_4_ * fVar74) * fVar74 + fVar74;
          fVar75 = (1.0 - auVar91._4_4_ * fVar75) * fVar75 + fVar75;
          fVar76 = (1.0 - auVar91._8_4_ * fVar76) * fVar76 + fVar76;
          fVar88 = (1.0 - auVar91._12_4_ * fVar88) * fVar88 + fVar88;
          auVar51 = rcpps(auVar51,auVar100);
          fVar89 = auVar51._0_4_;
          fVar114 = auVar51._4_4_;
          fVar95 = auVar51._8_4_;
          fVar97 = auVar51._12_4_;
          fVar89 = (1.0 - auVar100._0_4_ * fVar89) * fVar89 + fVar89;
          fVar114 = (1.0 - auVar100._4_4_ * fVar114) * fVar114 + fVar114;
          fVar95 = (1.0 - auVar100._8_4_ * fVar95) * fVar95 + fVar95;
          fVar97 = (1.0 - auVar100._12_4_ * fVar97) * fVar97 + fVar97;
          auVar51 = rcpps(auVar51,auVar32);
          fVar99 = auVar51._0_4_;
          fVar103 = auVar51._4_4_;
          fVar105 = auVar51._8_4_;
          fVar107 = auVar51._12_4_;
          fVar99 = (1.0 - auVar32._0_4_ * fVar99) * fVar99 + fVar99;
          fVar103 = (1.0 - auVar32._4_4_ * fVar103) * fVar103 + fVar103;
          fVar105 = (1.0 - auVar32._8_4_ * fVar105) * fVar105 + fVar105;
          fVar107 = (1.0 - auVar32._12_4_ * fVar107) * fVar107 + fVar107;
          uVar17 = (uint)DAT_01f46720;
          uVar23 = DAT_01f46720._4_4_;
          uVar24 = DAT_01f46720._8_4_;
          uVar25 = DAT_01f46720._12_4_;
          fVar67 = (*(float *)(uVar16 + 0x20) * local_1048 +
                   *(float *)(uVar16 + 0x50) * local_1058 +
                   *(float *)(uVar16 + 0x80) * local_1008 + *(float *)(uVar16 + 0xb0)) *
                   (float)((uint)fVar74 ^ uVar17);
          fVar78 = (*(float *)(uVar16 + 0x24) * fStack_1044 +
                   *(float *)(uVar16 + 0x54) * fStack_1054 +
                   *(float *)(uVar16 + 0x84) * fStack_1004 + *(float *)(uVar16 + 0xb4)) *
                   (float)((uint)fVar75 ^ uVar23);
          auVar60._0_8_ = CONCAT44(fVar78,fVar67);
          auVar60._8_4_ =
               (*(float *)(uVar16 + 0x28) * fStack_1040 +
               *(float *)(uVar16 + 0x58) * fStack_1050 +
               *(float *)(uVar16 + 0x88) * fStack_1000 + *(float *)(uVar16 + 0xb8)) *
               (float)((uint)fVar76 ^ uVar24);
          auVar60._12_4_ =
               (*(float *)(uVar16 + 0x2c) * fStack_103c +
               *(float *)(uVar16 + 0x5c) * fStack_104c +
               *(float *)(uVar16 + 0x8c) * fStack_ffc + *(float *)(uVar16 + 0xbc)) *
               (float)((uint)fVar88 ^ uVar25);
          fVar63 = (*(float *)(uVar16 + 0x30) * local_1048 +
                   *(float *)(uVar16 + 0x60) * local_1058 +
                   *(float *)(uVar16 + 0x90) * local_1008 + *(float *)(uVar16 + 0xc0)) *
                   (float)((uint)fVar89 ^ uVar17);
          fVar77 = (*(float *)(uVar16 + 0x34) * fStack_1044 +
                   *(float *)(uVar16 + 100) * fStack_1054 +
                   *(float *)(uVar16 + 0x94) * fStack_1004 + *(float *)(uVar16 + 0xc4)) *
                   (float)((uint)fVar114 ^ uVar23);
          auVar41._0_8_ = CONCAT44(fVar77,fVar63);
          auVar41._8_4_ =
               (*(float *)(uVar16 + 0x38) * fStack_1040 +
               *(float *)(uVar16 + 0x68) * fStack_1050 +
               *(float *)(uVar16 + 0x98) * fStack_1000 + *(float *)(uVar16 + 200)) *
               (float)((uint)fVar95 ^ uVar24);
          auVar41._12_4_ =
               (*(float *)(uVar16 + 0x3c) * fStack_103c +
               *(float *)(uVar16 + 0x6c) * fStack_104c +
               *(float *)(uVar16 + 0x9c) * fStack_ffc + *(float *)(uVar16 + 0xcc)) *
               (float)((uint)fVar97 ^ uVar25);
          fVar64 = (*(float *)(uVar16 + 0x40) * local_1048 +
                   local_ff8 * local_1058 +
                   *(float *)(uVar16 + 0xa0) * local_1008 + *(float *)(uVar16 + 0xd0)) *
                   (float)((uint)fVar99 ^ uVar17);
          fVar66 = (*(float *)(uVar16 + 0x44) * fStack_1044 +
                   fStack_ff4 * fStack_1054 +
                   *(float *)(uVar16 + 0xa4) * fStack_1004 + *(float *)(uVar16 + 0xd4)) *
                   (float)((uint)fVar103 ^ uVar23);
          auVar47._0_8_ = CONCAT44(fVar66,fVar64);
          auVar47._8_4_ =
               (*(float *)(uVar16 + 0x48) * fStack_1040 +
               fStack_ff0 * fStack_1050 +
               *(float *)(uVar16 + 0xa8) * fStack_1000 + *(float *)(uVar16 + 0xd8)) *
               (float)((uint)fVar105 ^ uVar24);
          auVar47._12_4_ =
               (*(float *)(uVar16 + 0x4c) * fStack_103c +
               fStack_fec * fStack_104c +
               *(float *)(uVar16 + 0xac) * fStack_ffc + *(float *)(uVar16 + 0xdc)) *
               (float)((uint)fVar107 ^ uVar25);
          fVar74 = fVar74 + fVar67;
          fVar75 = fVar75 + fVar78;
          fVar76 = fVar76 + auVar60._8_4_;
          fVar88 = fVar88 + auVar60._12_4_;
          auVar92._0_4_ = fVar89 + fVar63;
          auVar92._4_4_ = fVar114 + fVar77;
          auVar92._8_4_ = fVar95 + auVar41._8_4_;
          auVar92._12_4_ = fVar97 + auVar41._12_4_;
          auVar101._0_4_ = fVar99 + fVar64;
          auVar101._4_4_ = fVar103 + fVar66;
          auVar101._8_4_ = fVar105 + auVar47._8_4_;
          auVar101._12_4_ = fVar107 + auVar47._12_4_;
          auVar33._8_4_ = auVar41._8_4_;
          auVar33._0_8_ = auVar41._0_8_;
          auVar33._12_4_ = auVar41._12_4_;
          auVar51 = minps(auVar33,auVar92);
          auVar54._8_4_ = auVar47._8_4_;
          auVar54._0_8_ = auVar47._0_8_;
          auVar54._12_4_ = auVar47._12_4_;
          auVar40 = minps(auVar54,auVar101);
          auVar51 = maxps(auVar51,auVar40);
          auVar55._8_4_ = auVar60._8_4_;
          auVar55._0_8_ = auVar60._0_8_;
          auVar55._12_4_ = auVar60._12_4_;
          auVar10._4_4_ = fVar75;
          auVar10._0_4_ = fVar74;
          auVar10._8_4_ = fVar76;
          auVar10._12_4_ = fVar88;
          auVar62 = minps(auVar55,auVar10);
          auVar11._4_4_ = fVar75;
          auVar11._0_4_ = fVar74;
          auVar11._8_4_ = fVar76;
          auVar11._12_4_ = fVar88;
          auVar73 = maxps(auVar60,auVar11);
          auVar40 = maxps(auVar41,auVar92);
          auVar46 = maxps(auVar47,auVar101);
          auVar40 = minps(auVar40,auVar46);
          auVar13._4_4_ = fStack_1014;
          auVar13._0_4_ = local_1018;
          auVar13._8_4_ = fStack_1010;
          auVar13._12_4_ = fStack_100c;
          auVar46 = maxps(auVar13,auVar62);
          auVar46 = maxps(auVar46,auVar51);
          auVar34._4_4_ = fVar26;
          auVar34._0_4_ = fVar28;
          auVar34._8_4_ = fVar27;
          auVar34._12_4_ = fVar44;
          auVar51 = minps(auVar34,auVar73);
          auVar51 = minps(auVar51,auVar40);
          local_10c8._0_4_ = auVar46._0_4_ * 0.99999964;
          local_10c8._4_4_ = auVar46._4_4_ * 0.99999964;
          fStack_10c0 = auVar46._8_4_ * 0.99999964;
          fStack_10bc = auVar46._12_4_ * 0.99999964;
          auVar48._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar51._4_4_ * 1.0000004);
          auVar48._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar51._0_4_ * 1.0000004);
          auVar48._8_4_ = -(uint)(fStack_10c0 <= auVar51._8_4_ * 1.0000004);
          auVar48._12_4_ = -(uint)(fStack_10bc <= auVar51._12_4_ * 1.0000004);
          uVar17 = movmskps((int)context,auVar48);
          fVar63 = local_1018;
          fVar77 = fStack_1014;
          fVar64 = fStack_1010;
          fVar66 = fStack_100c;
          fVar67 = local_1068;
          fVar78 = fStack_1064;
          fVar74 = fStack_1060;
          fVar75 = fStack_105c;
          fVar76 = local_1048;
          fVar88 = fStack_1044;
          fVar89 = fStack_1040;
          fVar114 = fStack_103c;
          fVar95 = local_1058;
          fVar97 = fStack_1054;
          fVar99 = fStack_1050;
          fVar103 = fStack_104c;
          fVar105 = local_1008;
          fVar107 = fStack_1004;
          fVar110 = fStack_1000;
          fVar112 = fStack_ffc;
          fVar59 = local_10b8;
          fVar65 = fStack_10b4;
          fVar68 = fStack_10b0;
          fVar70 = fStack_10ac;
          fVar79 = local_1098;
          fVar80 = fStack_1094;
          fVar81 = fStack_1090;
          fVar82 = fStack_108c;
          fVar83 = local_10a8;
          fVar85 = fStack_10a4;
          fVar86 = fStack_10a0;
          fVar87 = fStack_109c;
          fVar90 = local_1028;
          fVar93 = fStack_1024;
          fVar94 = fStack_1020;
          fVar96 = fStack_101c;
          fVar98 = local_1038;
          fVar102 = fStack_1034;
          fVar104 = fStack_1030;
          fVar106 = fStack_102c;
        }
        context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar17);
        if (context == (RayQueryContext *)0x0) goto LAB_00568896;
        uVar16 = uVar15 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar15 = *(ulong *)(uVar16 + lVar6 * 8);
        uVar17 = uVar17 - 1 & uVar17;
        if (uVar17 != 0) {
          uVar23 = *(uint *)(local_10c8 + lVar6 * 4);
          lVar6 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar16 + lVar6 * 8);
          uVar24 = *(uint *)(local_10c8 + lVar6 * 4);
          uVar17 = uVar17 - 1 & uVar17;
          context = (RayQueryContext *)(ulong)uVar17;
          if (uVar17 == 0) {
            if (uVar23 < uVar24) {
              *(ulong *)*pauVar20 = uVar5;
              *(uint *)((long)*pauVar20 + 8) = uVar24;
              pauVar20 = pauVar20 + 1;
            }
            else {
              *(ulong *)*pauVar20 = uVar15;
              *(uint *)((long)*pauVar20 + 8) = uVar23;
              uVar15 = uVar5;
              pauVar20 = pauVar20 + 1;
            }
          }
          else {
            auVar35._8_4_ = uVar23;
            auVar35._0_8_ = uVar15;
            auVar35._12_4_ = 0;
            auVar42._8_4_ = uVar24;
            auVar42._0_8_ = uVar5;
            auVar42._12_4_ = 0;
            lVar6 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar15 = *(ulong *)(uVar16 + lVar6 * 8);
            iVar3 = *(int *)(local_10c8 + lVar6 * 4);
            auVar49._8_4_ = iVar3;
            auVar49._0_8_ = uVar15;
            auVar49._12_4_ = 0;
            auVar56._8_4_ = -(uint)((int)uVar23 < (int)uVar24);
            uVar17 = uVar17 - 1 & uVar17;
            if (uVar17 == 0) {
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar51 = auVar35 & auVar56 | ~auVar56 & auVar42;
              auVar40 = auVar42 & auVar56 | ~auVar56 & auVar35;
              auVar57._8_4_ = -(uint)(auVar51._8_4_ < iVar3);
              auVar57._0_8_ = CONCAT44(auVar57._8_4_,auVar57._8_4_);
              auVar57._12_4_ = auVar57._8_4_;
              uVar15 = ~auVar57._0_8_ & uVar15 | auVar51._0_8_ & auVar57._0_8_;
              auVar51 = auVar49 & auVar57 | ~auVar57 & auVar51;
              auVar36._8_4_ = -(uint)(auVar40._8_4_ < auVar51._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              *pauVar20 = ~auVar36 & auVar40 | auVar51 & auVar36;
              pauVar20[1] = auVar40 & auVar36 | ~auVar36 & auVar51;
              pauVar20 = pauVar20 + 2;
              fVar59 = local_10b8;
              fVar65 = fStack_10b4;
              fVar68 = fStack_10b0;
              fVar70 = fStack_10ac;
            }
            else {
              lVar6 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar4 = *(int *)(local_10c8 + lVar6 * 4);
              auVar61._8_4_ = iVar4;
              auVar61._0_8_ = *(undefined8 *)(uVar16 + lVar6 * 8);
              auVar61._12_4_ = 0;
              auVar58._4_4_ = auVar56._8_4_;
              auVar58._0_4_ = auVar56._8_4_;
              auVar58._8_4_ = auVar56._8_4_;
              auVar58._12_4_ = auVar56._8_4_;
              auVar51 = auVar35 & auVar58 | ~auVar58 & auVar42;
              auVar40 = auVar42 & auVar58 | ~auVar58 & auVar35;
              auVar72._0_4_ = -(uint)(iVar3 < iVar4);
              auVar72._4_4_ = -(uint)(iVar3 < iVar4);
              auVar72._8_4_ = -(uint)(iVar3 < iVar4);
              auVar72._12_4_ = -(uint)(iVar3 < iVar4);
              auVar46 = auVar49 & auVar72 | ~auVar72 & auVar61;
              auVar73 = ~auVar72 & auVar49 | auVar61 & auVar72;
              auVar50._8_4_ = -(uint)(auVar40._8_4_ < auVar73._8_4_);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              auVar62 = auVar40 & auVar50 | ~auVar50 & auVar73;
              auVar43._8_4_ = -(uint)(auVar51._8_4_ < auVar46._8_4_);
              auVar43._0_8_ = CONCAT44(auVar43._8_4_,auVar43._8_4_);
              auVar43._12_4_ = auVar43._8_4_;
              uVar15 = auVar51._0_8_ & auVar43._0_8_ | ~auVar43._0_8_ & auVar46._0_8_;
              auVar51 = ~auVar43 & auVar51 | auVar46 & auVar43;
              auVar37._8_4_ = -(uint)(auVar51._8_4_ < auVar62._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              *pauVar20 = ~auVar50 & auVar40 | auVar73 & auVar50;
              pauVar20[1] = ~auVar37 & auVar51 | auVar62 & auVar37;
              pauVar20[2] = auVar51 & auVar37 | ~auVar37 & auVar62;
              pauVar20 = pauVar20 + 3;
              fVar59 = local_10b8;
              fVar65 = fStack_10b4;
              fVar68 = fStack_10b0;
              fVar70 = fStack_10ac;
              fVar79 = local_1098;
              fVar80 = fStack_1094;
              fVar81 = fStack_1090;
              fVar82 = fStack_108c;
              fVar83 = local_10a8;
              fVar85 = fStack_10a4;
              fVar86 = fStack_10a0;
              fVar87 = fStack_109c;
            }
          }
        }
        goto LAB_005688bb;
      }
      goto LAB_00568896;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }